

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall
LongReadsMapper::map_reads
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  void *this_00;
  const_reference pvVar5;
  size_type sVar6;
  const_iterator __position;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  __first;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  __last;
  ostream *poVar7;
  ostream *this_01;
  ulong uVar8;
  long *in_RDI;
  reference rVar9;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *__range1;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *fblocks;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> blocks;
  uint64_t i;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  uint32_t readID;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  char *query_sequence_ptr;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  ReadSequenceBuffer sequenceGetter;
  value_type *private_results;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  StreamKmerFactory skf;
  uint64_t multi_matches;
  uint64_t single_matches;
  uint64_t no_matches;
  uint32_t num_reads_done;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  shared_ptr<SatKmerIndex> skindex;
  shared_ptr<NKmerIndex> nkindex;
  undefined7 in_stack_fffffffffffffa68;
  uint8_t in_stack_fffffffffffffa6f;
  NKmerIndex *in_stack_fffffffffffffa70;
  LongReadsDatastore *in_stack_fffffffffffffa78;
  ReadSequenceBuffer *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  StreamKmerFactory *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa8;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_fffffffffffffab0;
  __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  in_stack_fffffffffffffab8;
  __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  in_stack_fffffffffffffac0;
  const_iterator in_stack_fffffffffffffac8;
  iterator in_stack_fffffffffffffad8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffffae0;
  SatKmerIndex *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  uint in_stack_fffffffffffffaf4;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  *in_stack_fffffffffffffaf8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffffb00;
  _Bit_type in_stack_fffffffffffffb08;
  _Bit_type *in_stack_fffffffffffffb10;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffffb48;
  ReadSequenceBuffer *in_stack_fffffffffffffb50;
  __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
  local_3e8;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *local_3e0;
  LongReadMapping *local_3d8;
  LongReadMapping *local_3d0;
  LongReadMapping *local_3c8;
  LongReadMapping *local_3c0;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_3b0;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> local_3a8;
  reference local_390;
  ulong local_380;
  uint local_348;
  pointer in_stack_fffffffffffffcc8;
  uint32_t in_stack_fffffffffffffcd4;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *matches;
  uint32_t in_stack_fffffffffffffce4;
  LongReadsMapper *in_stack_fffffffffffffce8;
  SatKmerIndex local_2c0 [4];
  int in_stack_fffffffffffffe30;
  uint8_t in_stack_fffffffffffffe37;
  SequenceDistanceGraph *in_stack_fffffffffffffe38;
  NKmerIndex *in_stack_fffffffffffffe40;
  uint8_t in_stack_fffffffffffffe56;
  uint8_t in_stack_fffffffffffffe57;
  SequenceDistanceGraph *in_stack_fffffffffffffe58;
  SatKmerIndex *in_stack_fffffffffffffe60;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint local_60;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  local_58 [3];
  
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::clear
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f3920);
  std::shared_ptr<NKmerIndex>::shared_ptr((shared_ptr<NKmerIndex> *)0x3f392d);
  std::shared_ptr<SatKmerIndex>::shared_ptr((shared_ptr<SatKmerIndex> *)0x3f393a);
  if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
    operator_new(0x50);
    NKmerIndex::NKmerIndex
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
               in_stack_fffffffffffffe30);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>
              ((__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffa80,
               (NKmerIndex *)in_stack_fffffffffffffa78);
  }
  else {
    operator_new(0x38);
    SatKmerIndex::SatKmerIndex
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe57,
               in_stack_fffffffffffffe56);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              ((__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffa80,
               (SatKmerIndex *)in_stack_fffffffffffffa78);
  }
  omp_get_max_threads();
  std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>::allocator
            ((allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_> *)0x3f3a92)
  ;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::vector((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
            *)in_stack_fffffffffffffa90,(size_type)in_stack_fffffffffffffa88,
           (allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>::~allocator
            ((allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_> *)0x3f3abe)
  ;
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  StreamKmerFactory::StreamKmerFactory
            ((StreamKmerFactory *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *
         )0x3f3b15);
  iVar2 = omp_get_thread_num();
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::operator[](local_58,(long)iVar2);
  ReadSequenceBuffer::ReadSequenceBuffer
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,(size_t)in_stack_fffffffffffffa70,
             CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)0x3f3b77);
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f3bab);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa90,
             (size_type)in_stack_fffffffffffffa88,(allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f3bd7);
  rVar9._M_mask = in_stack_fffffffffffffb08;
  rVar9._M_p = in_stack_fffffffffffffb10;
  local_348 = 1;
  do {
    uVar8 = (ulong)local_348;
    sVar3 = LongReadsDatastore::size((LongReadsDatastore *)0x3f3c02);
    if (sVar3 < uVar8) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa80)
      ;
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)in_stack_fffffffffffffa80);
      ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)in_stack_fffffffffffffa70);
      std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
      ::~vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffa80);
      __position._M_current =
           (LongReadMapping *)
           sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffa98 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffa98 >> 0x18,0));
      __first._M_current =
           (LongReadMapping *)std::operator<<((ostream *)__position._M_current,"Read results:    ");
      __last._M_current = (LongReadMapping *)std::ostream::operator<<(__first._M_current,local_68);
      poVar4 = std::operator<<((ostream *)__last._M_current," no match    ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar4,local_70);
      poVar7 = std::operator<<(poVar7," single match    ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_78);
      this_01 = std::operator<<(poVar7," multi matches");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      local_3e0 = local_58;
      local_3e8._M_current =
           (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
           std::
           vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ::begin((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::end((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
                            *)in_stack_fffffffffffffa70,
                           (__normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
        ::operator*(&local_3e8);
        in_stack_fffffffffffffa80 = (ReadSequenceBuffer *)(in_RDI + 6);
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
        __gnu_cxx::
        __normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>
        ::__normal_iterator<LongReadMapping*>
                  ((__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    *)in_stack_fffffffffffffa70,
                   (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)poVar4,__position,
                   __first,__last);
        __gnu_cxx::
        __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
        ::operator++(&local_3e8);
      }
      poVar4 = sdglib::OutputLog((LogLevels)((ulong)poVar7 >> 0x20),SUB81((ulong)poVar7 >> 0x18,0));
      poVar4 = std::operator<<(poVar4,"Updating mapping indexes");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      update_indexes((LongReadsMapper *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::~vector((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 *)in_stack_fffffffffffffa80);
      std::shared_ptr<SatKmerIndex>::~shared_ptr((shared_ptr<SatKmerIndex> *)0x3f4583);
      std::shared_ptr<NKmerIndex>::~shared_ptr((shared_ptr<NKmerIndex> *)0x3f4590);
      return;
    }
    local_60 = local_60 + 1;
    if (local_60 % 10000 == 0) {
      poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffa98 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffa98 >> 0x18,0));
      poVar4 = std::operator<<(poVar4,"Thread #");
      iVar2 = omp_get_thread_num();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," processing its read #");
      this_00 = (void *)std::ostream::operator<<(poVar4,local_60);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)0x3f3da3);
    if (bVar1) {
LAB_003f3dd9:
      pvVar5 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::operator[]
                         ((vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)(in_RDI[5] + 0x10),
                          (ulong)local_348);
      if ((uint)((int)in_RDI[2] << 1) <= pvVar5->record_size) {
        in_stack_fffffffffffffb48 =
             (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)ReadSequenceBuffer::get_read_sequence
                          (in_stack_fffffffffffffb50,(uint64_t)in_stack_fffffffffffffb48);
        matches = in_stack_fffffffffffffb48;
        std::
        vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
        clear((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               *)0x3f3e55);
        StreamKmerFactory::produce_all_kmers
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                   (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa80);
        sVar6 = std::
                vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                ::size((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                        *)local_2c0);
        if ((ulong)(long)((int)in_RDI[2] << 1) <= sVar6) {
          if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
            std::
            vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ::size((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    *)local_2c0);
            std::allocator<bool>::allocator((allocator<bool> *)0x3f3f0a);
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffa80,
                       (size_type)in_stack_fffffffffffffa78,
                       (allocator_type *)in_stack_fffffffffffffa70);
            std::allocator<bool>::~allocator((allocator<bool> *)0x3f3f36);
            local_380 = 0;
            while( true ) {
              uVar8 = local_380;
              sVar6 = std::
                      vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      ::size((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                              *)local_2c0);
              if (sVar6 <= uVar8) break;
              std::__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3f3f80);
              std::
              vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                            *)local_2c0,local_380);
              bVar1 = NKmerIndex::filter(in_stack_fffffffffffffa70,
                                         CONCAT17(in_stack_fffffffffffffa6f,
                                                  in_stack_fffffffffffffa68));
              rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffa90,
                                 (size_type)in_stack_fffffffffffffa88);
              local_390 = rVar9;
              std::_Bit_reference::operator=(&local_390,bVar1);
              local_380 = local_380 + 1;
            }
            std::__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffffa70);
            get_all_kmer_matches
                      ((LongReadsMapper *)rVar9._M_p,(NKmerIndex *)rVar9._M_mask,
                       in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                       (vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)0x3f40c1);
          }
          else {
            std::__shared_ptr_access<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )in_stack_fffffffffffffa70);
            get_sat_kmer_matches
                      ((LongReadsMapper *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                       (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                        *)in_stack_fffffffffffffad8._M_current);
          }
          in_stack_fffffffffffffae8 = local_2c0;
          std::
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
          size((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                *)in_stack_fffffffffffffae8);
          in_stack_fffffffffffffb00 =
               (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                *)&stack0xfffffffffffffcc0;
          in_stack_fffffffffffffaf8 =
               (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                *)&stack0xfffffffffffffce0;
          count_candidates((LongReadsMapper *)in_stack_fffffffffffffac0._M_current,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffab8._M_current,
                           (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            *)in_stack_fffffffffffffab0,
                           (uint32_t)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          in_stack_fffffffffffffaf4 = local_348;
          std::
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
          size((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                *)in_stack_fffffffffffffae8);
          alignment_blocks(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,matches,
                           in_stack_fffffffffffffcd4,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffae0 =
               (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f415e);
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &stack0xfffffffffffffcc0);
          memset(in_stack_fffffffffffffae0,0,sVar6);
          bVar1 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::empty
                            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                             in_stack_fffffffffffffa80);
          if (bVar1) {
            local_68 = local_68 + 1;
          }
          else {
            sVar6 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::size(&local_3a8)
            ;
            if (sVar6 == 1) {
              local_70 = local_70 + 1;
            }
            else {
              local_78 = local_78 + 1;
            }
          }
          local_3b0 = &local_3a8;
          local_3c0 = (LongReadMapping *)
                      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                                ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                                 CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
          __gnu_cxx::
          __normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>
          ::__normal_iterator<LongReadMapping*>
                    ((__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                      *)in_stack_fffffffffffffa70,
                     (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                      *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
          local_3c8 = (LongReadMapping *)
                      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                                ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                                 CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
          local_3d0 = (LongReadMapping *)
                      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                                ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                                 CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
          in_stack_fffffffffffffad8 =
               std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
               insert<__gnu_cxx::__normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
                         (in_stack_fffffffffffffab0,in_stack_fffffffffffffac8,
                          in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
          local_3d8 = in_stack_fffffffffffffad8._M_current;
          std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::~vector
                    ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                     in_stack_fffffffffffffa80);
        }
      }
    }
    else {
      in_stack_fffffffffffffb50 =
           (ReadSequenceBuffer *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)in_stack_fffffffffffffa70,
                   (key_type *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
      if (in_stack_fffffffffffffb50 != (ReadSequenceBuffer *)0x0) goto LAB_003f3dd9;
    }
    local_348 = local_348 + 1;
  } while( true );
}

Assistant:

void LongReadsMapper::map_reads(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);

#pragma omp for schedule(static,1000) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find match candidates in fixed windows ==========

            count_candidates(candidate_counts, node_matches,read_kmers.size());

            //========== 3. Create alignment blocks from candidates ==========

            auto blocks(alignment_blocks(readID,node_matches,read_kmers.size(), candidate_counts));
            std::memset(candidate_counts.data(), 0, candidate_counts.size());

            //========== 4. Construct mapping path ==========
            if (blocks.empty()) ++no_matches;
            else if (blocks.size()==1) ++single_matches;
            else ++multi_matches;
            //TODO: align blocks that occupy the same space as longer/better blocks should be thrown away.

            //auto fblocks=filter_blocks(blocks,node_matches,read_kmers.size());
            const auto &fblocks = blocks;

//            std::cout<<"READ " << readID << " mappings, after FILTERING:"<<std::endl;
//            for (auto b:fblocks)
//                std::cout << "READ\tTarget: " << b.node << " (" << sdg.nodes[llabs(b.node)].sequence.size() << " bp)  "
//                          << b.qStart << ":" << b.qEnd << " -> " << b.nStart << ":" << b.nEnd
//                          << " (" << b.score << " chained hits, " << b.qEnd - b.qStart + k << "bp, "
//                          << b.score * 100 / (b.qEnd - b.qStart) << "%)"
//                          << std::endl;

            private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
        }
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}